

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O1

Real __thiscall amrex::CoordSys::AreaHi(CoordSys *this,IntVect *point,int dir)

{
  Real RVar1;
  
  if (dir == 2) {
    return this->dx[1] * this->dx[0];
  }
  if (dir == 1) {
    RVar1 = this->dx[0];
  }
  else {
    if (dir != 0) {
      return 0.0;
    }
    RVar1 = this->dx[1];
  }
  return RVar1 * this->dx[2];
}

Assistant:

Real
CoordSys::AreaHi (const IntVect& point, int dir) const noexcept
{
    amrex::ignore_unused(point,dir);
#if (AMREX_SPACEDIM==2)
    Real xhi[AMREX_SPACEDIM];
    switch (c_sys)
    {
    case cartesian:
        switch (dir)
        {
        case 0: return dx[1];
        case 1: return dx[0];
        }
        return 0._rt; // to silent compiler warning
    case RZ:
        HiNode(point,xhi);
        switch (dir)
        {
        case 0: return Real(TWOPI)*dx[1]*xhi[0];
        case 1: return (xhi[0]*xhi[0]-(xhi[0]-dx[0])*(xhi[0]-dx[0]))*static_cast<Real>(TWOPI*0.5);
        }
        return 0._rt; // to silent compiler warning
    default:
        AMREX_ASSERT(0);
    }
#endif
#if (AMREX_SPACEDIM==3)
    switch (dir)
    {
    case 0: return dx[1]*dx[2];
    case 1: return dx[0]*dx[2];
    case 2: return dx[1]*dx[0];
    }
#endif
    return 0._rt;
}